

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcp.c
# Opt level: O2

int maybe_new_socket(uv_tcp_t *handle,int domain,int flags)

{
  int fd;
  int iVar1;
  int iVar2;
  
  if ((domain == 0) || ((handle->io_watcher).fd != -1)) {
    handle->flags = handle->flags | flags;
    iVar2 = 0;
  }
  else {
    fd = uv__socket(domain,1,0);
    iVar2 = fd;
    if ((-1 < fd) &&
       (iVar1 = uv__stream_open((uv_stream_t *)handle,fd,flags), iVar2 = 0, iVar1 != 0)) {
      uv__close(fd);
      iVar2 = iVar1;
    }
  }
  return iVar2;
}

Assistant:

static int maybe_new_socket(uv_tcp_t* handle, int domain, int flags) {
  int sockfd;
  int err;

  if (domain == AF_UNSPEC || uv__stream_fd(handle) != -1) {
    handle->flags |= flags;
    return 0;
  }

  err = uv__socket(domain, SOCK_STREAM, 0);
  if (err < 0)
    return err;
  sockfd = err;

  err = uv__stream_open((uv_stream_t*) handle, sockfd, flags);
  if (err) {
    uv__close(sockfd);
    return err;
  }

  return 0;
}